

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseGTMCoverage.cxx
# Opt level: O0

bool __thiscall cmParseGTMCoverage::ReadMCovFile(cmParseGTMCoverage *this,char *file)

{
  cmCTest *pcVar1;
  byte bVar2;
  bool bVar3;
  __type _Var4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  mapped_type *pmVar8;
  reference pvVar9;
  ostream *poVar10;
  char *pcVar11;
  string local_668 [32];
  undefined1 local_648 [8];
  ostringstream cmCTestLog_msg_1;
  SingleFileCoverageVector *coverageVector;
  int lineoffset;
  bool found;
  undefined1 local_4a0 [8];
  ostringstream cmCTestLog_msg;
  int local_328;
  int local_324;
  int count;
  int linenumber;
  string routine;
  string function;
  string filepath;
  undefined1 local_2b8 [4];
  int lastoffset;
  string lastpath;
  string lastroutine;
  string lastfunction;
  string line;
  long local_228;
  ifstream in;
  char *file_local;
  cmParseGTMCoverage *this_local;
  
  std::ifstream::ifstream(&local_228,file,_S_in);
  bVar2 = std::ios::operator!((ios *)((long)&local_228 + *(long *)(local_228 + -0x18)));
  if ((bVar2 & 1) == 0) {
    std::__cxx11::string::string((string *)(lastfunction.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)(lastroutine.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)(lastpath.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_2b8);
    filepath.field_2._12_4_ = 0;
    while (bVar3 = cmsys::SystemTools::GetLineFromStream
                             ((istream *)&local_228,(string *)((long)&lastfunction.field_2 + 8),
                              (bool *)0x0,-1), bVar3) {
      lVar6 = std::__cxx11::string::find(lastfunction.field_2._M_local_buf + 8,0xa51479);
      if (lVar6 != -1) {
        std::__cxx11::string::string((string *)(function.field_2._M_local_buf + 8));
        std::__cxx11::string::string((string *)(routine.field_2._M_local_buf + 8));
        std::__cxx11::string::string((string *)&count);
        local_324 = 0;
        local_328 = 0;
        ParseMCOVLine(this,(string *)((long)&lastfunction.field_2 + 8),(string *)&count,
                      (string *)(routine.field_2._M_local_buf + 8),&local_324,&local_328);
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&count,"RSEL");
        if (!bVar3) {
          _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&routine.field_2 + 8),
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&lastroutine.field_2 + 8));
          if ((_Var4) &&
             (_Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)&lastpath.field_2 + 8),
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&count), _Var4)) {
            uVar7 = std::__cxx11::string::empty();
            iVar5 = local_328;
            if ((uVar7 & 1) == 0) {
              pmVar8 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                       ::operator[](&((this->super_cmParseMumpsCoverage).Coverage)->TotalCoverage,
                                    (key_type *)local_2b8);
              pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (pmVar8,(long)(filepath.field_2._12_4_ + local_324));
              *pvVar9 = iVar5 + *pvVar9;
            }
            else {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a0);
              poVar10 = std::operator<<((ostream *)local_4a0,"Can not find mumps file : ");
              poVar10 = std::operator<<(poVar10,(string *)(lastpath.field_2._M_local_buf + 8));
              poVar10 = std::operator<<(poVar10,"  referenced in this line of mcov data:\n[");
              poVar10 = std::operator<<(poVar10,(string *)(lastfunction.field_2._M_local_buf + 8));
              std::operator<<(poVar10,"]\n");
              pcVar1 = (this->super_cmParseMumpsCoverage).CTest;
              std::__cxx11::ostringstream::str();
              pcVar11 = (char *)std::__cxx11::string::c_str();
              cmCTest::Log(pcVar1,5,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmParseGTMCoverage.cxx"
                           ,0x5e,pcVar11,false);
              std::__cxx11::string::~string((string *)&lineoffset);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4a0);
            }
          }
          else {
            coverageVector._7_1_ =
                 cmParseMumpsCoverage::FindMumpsFile
                           (&this->super_cmParseMumpsCoverage,(string *)&count,
                            (string *)((long)&function.field_2 + 8));
            if ((bool)coverageVector._7_1_) {
              coverageVector._0_4_ = 0;
              bVar3 = FindFunctionInMumpsFile
                                (this,(string *)((long)&function.field_2 + 8),
                                 (string *)((long)&routine.field_2 + 8),(int *)&coverageVector);
              if (bVar3) {
                pmVar8 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                         ::operator[](&((this->super_cmParseMumpsCoverage).Coverage)->TotalCoverage,
                                      (key_type *)((long)&function.field_2 + 8));
                pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                                   (pmVar8,(long)((int)coverageVector + local_324));
                iVar5 = local_328;
                if ((*pvVar9 == -1) && (0 < local_328)) {
                  iVar5 = local_328 + 1;
                  pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                                     (pmVar8,(long)((int)coverageVector + local_324));
                  *pvVar9 = iVar5 + *pvVar9;
                }
                else {
                  pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                                     (pmVar8,(long)((int)coverageVector + local_324));
                  *pvVar9 = iVar5 + *pvVar9;
                }
                filepath.field_2._12_4_ = (int)coverageVector;
              }
            }
            else {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_648);
              poVar10 = std::operator<<((ostream *)local_648,"Can not find mumps file : ");
              poVar10 = std::operator<<(poVar10,(string *)&count);
              poVar10 = std::operator<<(poVar10,"  referenced in this line of mcov data:\n[");
              poVar10 = std::operator<<(poVar10,(string *)(lastfunction.field_2._M_local_buf + 8));
              std::operator<<(poVar10,"]\n");
              pcVar1 = (this->super_cmParseMumpsCoverage).CTest;
              std::__cxx11::ostringstream::str();
              pcVar11 = (char *)std::__cxx11::string::c_str();
              cmCTest::Log(pcVar1,5,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmParseGTMCoverage.cxx"
                           ,0x82,pcVar11,false);
              std::__cxx11::string::~string(local_668);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_648);
            }
            std::__cxx11::string::operator=
                      ((string *)(lastroutine.field_2._M_local_buf + 8),
                       (string *)(routine.field_2._M_local_buf + 8));
            std::__cxx11::string::operator=
                      ((string *)(lastpath.field_2._M_local_buf + 8),(string *)&count);
            std::__cxx11::string::operator=
                      ((string *)local_2b8,(string *)(function.field_2._M_local_buf + 8));
          }
        }
        std::__cxx11::string::~string((string *)&count);
        std::__cxx11::string::~string((string *)(routine.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(function.field_2._M_local_buf + 8));
      }
    }
    this_local._7_1_ = true;
    std::__cxx11::string::~string((string *)local_2b8);
    std::__cxx11::string::~string((string *)(lastpath.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(lastroutine.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(lastfunction.field_2._M_local_buf + 8));
  }
  else {
    this_local._7_1_ = false;
  }
  std::ifstream::~ifstream(&local_228);
  return this_local._7_1_;
}

Assistant:

bool cmParseGTMCoverage::ReadMCovFile(const char* file)
{
  cmsys::ifstream in(file);
  if(!in)
    {
    return false;
    }
  std::string line;
  std::string lastfunction;
  std::string lastroutine;
  std::string lastpath;
  int lastoffset = 0;
  while(  cmSystemTools::GetLineFromStream(in, line))
    {
    // only look at lines that have coverage data
    if(line.find("^ZZCOVERAGE") == line.npos)
      {
      continue;
      }
    std::string filepath;
    std::string function;
    std::string routine;
    int linenumber = 0;
    int count = 0;
    this->ParseMCOVLine(line, routine, function, linenumber, count);
    // skip this one
    if(routine == "RSEL")
      {
      continue;
      }
    // no need to search the file if we just did it
    if(function == lastfunction && lastroutine == routine)
      {
      if(!lastpath.empty())
        {
        this->Coverage.TotalCoverage[lastpath][lastoffset + linenumber]
          += count;
        }
      else
        {
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "Can not find mumps file : "
                   << lastroutine <<
                   "  referenced in this line of mcov data:\n"
                   "[" << line << "]\n");
        }
      continue;
      }
    // Find the full path to the file
    bool found = this->FindMumpsFile(routine, filepath);
    if(found)
      {
      int lineoffset = 0;
      if(this->FindFunctionInMumpsFile(filepath,
                                       function,
                                       lineoffset))
        {
        cmCTestCoverageHandlerContainer::SingleFileCoverageVector&
          coverageVector = this->Coverage.TotalCoverage[filepath];
        // This section accounts for lines that were previously marked
        // as non-executable code (-1), if the parser comes back with
        // a non-zero count, increase the count by 1 to push the line
        // into the executable code set in addtion to the count found.
        if(coverageVector[lineoffset + linenumber] == -1 &&
           count > 0)
          {
          coverageVector[lineoffset + linenumber] += count+1;
          }
        else
          {
          coverageVector[lineoffset + linenumber] += count;
          }
        lastoffset = lineoffset;
        }
      }
    else
      {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Can not find mumps file : "
               << routine << "  referenced in this line of mcov data:\n"
                 "[" << line << "]\n");
      }
    lastfunction = function;
    lastroutine = routine;
    lastpath = filepath;
    }
  return true;
}